

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

void __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::InternalSwap
          (RepeatedPtrFieldBase *this,RepeatedPtrFieldBase *other)

{
  Arena *this_00;
  Arena *pAVar1;
  RepeatedPtrFieldBase *in_RSI;
  RepeatedPtrFieldBase *in_RDI;
  undefined4 in_stack_ffffffffffffff28;
  int in_stack_ffffffffffffff2c;
  LogMessage *in_stack_ffffffffffffff30;
  LogMessage *this_01;
  undefined8 in_stack_ffffffffffffff38;
  LogLevel_conflict level;
  LogMessage *in_stack_ffffffffffffff40;
  LogMessage local_98;
  byte local_49;
  RepeatedPtrFieldBase *local_10;
  
  level = (LogLevel_conflict)((ulong)in_stack_ffffffffffffff38 >> 0x20);
  local_49 = 0;
  local_10 = in_RSI;
  if (in_RDI == in_RSI) {
    LogMessage::LogMessage
              (in_stack_ffffffffffffff40,level,(char *)in_stack_ffffffffffffff30,
               in_stack_ffffffffffffff2c);
    local_49 = 1;
    LogMessage::operator<<
              (in_stack_ffffffffffffff30,
               (char *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
    LogFinisher::operator=
              ((LogFinisher *)in_stack_ffffffffffffff30,
               (LogMessage *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  }
  if ((local_49 & 1) != 0) {
    LogMessage::~LogMessage((LogMessage *)0x1c6bda);
  }
  this_00 = GetArenaNoVirtual(in_RDI);
  pAVar1 = GetArenaNoVirtual(local_10);
  if (this_00 != pAVar1) {
    this_01 = &local_98;
    LogMessage::LogMessage((LogMessage *)this_00,level,(char *)this_01,in_stack_ffffffffffffff2c);
    LogMessage::operator<<
              (this_01,(char *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
    LogFinisher::operator=
              ((LogFinisher *)this_01,
               (LogMessage *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
    LogMessage::~LogMessage((LogMessage *)0x1c6c6d);
  }
  std::swap<google::protobuf::internal::RepeatedPtrFieldBase::Rep*>(&in_RDI->rep_,&local_10->rep_);
  std::swap<int>(&in_RDI->current_size_,&local_10->current_size_);
  std::swap<int>(&in_RDI->total_size_,&local_10->total_size_);
  return;
}

Assistant:

void RepeatedPtrFieldBase::InternalSwap(RepeatedPtrFieldBase* other) {
  GOOGLE_DCHECK(this != other);
  GOOGLE_DCHECK(GetArenaNoVirtual() == other->GetArenaNoVirtual());

  std::swap(rep_, other->rep_);
  std::swap(current_size_, other->current_size_);
  std::swap(total_size_, other->total_size_);
}